

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void icetImageSetDimensions(IceTImage image,IceTSizeType width,IceTSizeType height)

{
  IceTBoolean IVar1;
  IceTEnum color_format;
  IceTEnum depth_format;
  IceTSizeType IVar2;
  IceTSizeType height_local;
  IceTSizeType width_local;
  IceTImage image_local;
  
  IVar1 = icetImageIsNull(image);
  if (IVar1 == '\0') {
    if (*(int *)((long)image.opaque_internals + 0x14) < width * height) {
      icetRaiseDiagnostic("Cannot set an image size to greater than what the image was originally created."
                          ,0xfffffffa,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x245);
    }
    else {
      *(IceTSizeType *)((long)image.opaque_internals + 0xc) = width;
      *(IceTSizeType *)((long)image.opaque_internals + 0x10) = height;
      color_format = icetImageGetColorFormat(image);
      depth_format = icetImageGetDepthFormat(image);
      IVar2 = icetImageBufferSizeType(color_format,depth_format,width,height);
      *(IceTSizeType *)((long)image.opaque_internals + 0x18) = IVar2;
    }
  }
  else {
    icetRaiseDiagnostic("Cannot set number of pixels on null image.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x23e);
  }
  return;
}

Assistant:

void icetImageSetDimensions(IceTImage image,
                            IceTSizeType width,
                            IceTSizeType height)
{
    ICET_TEST_IMAGE_HEADER(image);

    if (icetImageIsNull(image)) {
        icetRaiseError("Cannot set number of pixels on null image.",
                       ICET_INVALID_VALUE);
        return;
    }

    if (   width*height
         > ICET_IMAGE_HEADER(image)[ICET_IMAGE_MAX_NUM_PIXELS_INDEX] ){
        icetRaiseError("Cannot set an image size to greater than what the"
                       " image was originally created.", ICET_INVALID_VALUE);
        return;
    }

    ICET_IMAGE_HEADER(image)[ICET_IMAGE_WIDTH_INDEX] = (IceTInt)width;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_HEIGHT_INDEX] = (IceTInt)height;
    ICET_IMAGE_HEADER(image)[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX]
        = (IceTInt)icetImageBufferSizeType(icetImageGetColorFormat(image),
                                           icetImageGetDepthFormat(image),
                                           width,
                                           height);
}